

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::UniformCase::checkUniformDefaultValues
          (UniformCase *this,
          vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  ostringstream *this_00;
  float fVar1;
  DataType DVar2;
  TestLog *pTVar3;
  pointer pVVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ostringstream *poVar9;
  pointer pBVar10;
  long local_1d0;
  undefined1 local_1b0 [384];
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar5 = true;
  local_1d0 = 4;
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar7 = 0;
  while( true ) {
    poVar9 = (ostringstream *)(local_1b0 + 8);
    pBVar10 = (basicUniforms->
              super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(basicUniforms->
                     super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) / 0x98) <= lVar7)
    break;
    pVVar4 = (values->
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = glu::getDataTypeScalarSize(pBVar10[lVar7].type);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar9);
    std::operator<<((ostream *)poVar9,"// Checking uniform ");
    pBVar10 = pBVar10 + lVar7;
    std::operator<<((ostream *)poVar9,(string *)pBVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar9);
    if (pVVar4[lVar7].type != TYPE_INVALID) {
      DVar2 = pBVar10->type;
      if ((DVar2 - TYPE_FLOAT < 4) || (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9))
      {
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          fVar1 = *(float *)((long)&pVVar4->type + uVar8 * 4 + local_1d0);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            local_1b0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::operator<<((ostream *)this_00,"// FAILURE: uniform ");
            std::operator<<((ostream *)this_00,(string *)pBVar10);
            std::operator<<((ostream *)this_00," has non-zero initial value");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            bVar5 = false;
          }
        }
      }
      else {
        poVar9 = (ostringstream *)(local_1b0 + 8);
        if (DVar2 - TYPE_INT < 4) {
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            if (*(int *)((long)&pVVar4->type + uVar8 * 4 + local_1d0) != 0) {
              local_1b0._0_8_ = pTVar3;
              std::__cxx11::ostringstream::ostringstream(poVar9);
              std::operator<<((ostream *)poVar9,"// FAILURE: uniform ");
              std::operator<<((ostream *)poVar9,(string *)pBVar10);
              std::operator<<((ostream *)poVar9," has non-zero initial value");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar9);
              bVar5 = false;
            }
          }
        }
        else if (DVar2 - TYPE_UINT < 4) {
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            if (*(int *)((long)&pVVar4->type + uVar8 * 4 + local_1d0) != 0) {
              local_1b0._0_8_ = pTVar3;
              std::__cxx11::ostringstream::ostringstream(poVar9);
              std::operator<<((ostream *)poVar9,"// FAILURE: uniform ");
              std::operator<<((ostream *)poVar9,(string *)pBVar10);
              std::operator<<((ostream *)poVar9," has non-zero initial value");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar9);
              bVar5 = false;
            }
          }
        }
        else if (DVar2 - TYPE_BOOL < 4) {
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            if (*(char *)((long)&pVVar4->type + uVar8 + local_1d0) == '\x01') {
              local_1b0._0_8_ = pTVar3;
              std::__cxx11::ostringstream::ostringstream(poVar9);
              std::operator<<((ostream *)poVar9,"// FAILURE: uniform ");
              std::operator<<((ostream *)poVar9,(string *)pBVar10);
              std::operator<<((ostream *)poVar9," has non-zero initial value");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar9);
              bVar5 = false;
            }
          }
        }
        else if ((0xffffffe1 < DVar2 - TYPE_IMAGE_2D) &&
                (poVar9 = (ostringstream *)(local_1b0 + 8), pVVar4[lVar7].val.intV[0] != 0)) {
          local_1b0._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar9);
          std::operator<<((ostream *)poVar9,"// FAILURE: uniform ");
          std::operator<<((ostream *)poVar9,(string *)pBVar10);
          std::operator<<((ostream *)poVar9," has non-zero initial value");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar9);
          bVar5 = false;
        }
      }
    }
    lVar7 = lVar7 + 1;
    local_1d0 = local_1d0 + 0x44;
  }
  return bVar5;
}

Assistant:

bool UniformCase::checkUniformDefaultValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	DE_ASSERT(values.size() == basicUniforms.size());

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];
		const int				valSize		= glu::getDataTypeScalarSize(uniform.type);

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

#define CHECK_UNIFORM(VAR_VALUE_MEMBER, ZERO)																								\
	do																																		\
	{																																		\
		for (int i = 0; i < valSize; i++)																									\
		{																																	\
			if (unifValue.val.VAR_VALUE_MEMBER[i] != (ZERO))																				\
			{																																\
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;	\
				success = false;																											\
			}																																\
		}																																	\
	} while (false)

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			CHECK_UNIFORM(floatV, 0.0f);
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			CHECK_UNIFORM(intV, 0);
		else if (glu::isDataTypeUintOrUVec(uniform.type))
			CHECK_UNIFORM(uintV, 0);
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
			CHECK_UNIFORM(boolV, false);
		else if (glu::isDataTypeSampler(uniform.type))
		{
			if (unifValue.val.samplerV.unit != 0)
			{
				log << TestLog::Message << "// FAILURE: uniform " << uniform.name << " has non-zero initial value" << TestLog::EndMessage;
				success = false;
			}
		}
		else
			DE_ASSERT(false);

#undef CHECK_UNIFORM
	}

	return success;
}